

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O2

callbacks pstore::exchange::import_ns::callbacks::
          make<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,pstore::uint128_const*>,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,pstore::uint128_const*>
                    (not_null<pstore::database_*> db,
                    transaction<std::unique_lock<mock_mutex>_> *args,string_mapping *args_1,
                    uint128 *args_2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  callbacks cVar1;
  shared_ptr<pstore::exchange::import_ns::context> ctxt;
  _Head_base<0UL,_pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::transaction<std::unique_lock<mock_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*,_const_pstore::uint128_*>_*,_false>
  local_70;
  _Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false> local_68;
  shared_ptr<pstore::exchange::import_ns::context> local_60;
  database *local_50 [2];
  uint128 *local_40;
  string_mapping *local_38 [2];
  
  std::
  make_shared<pstore::exchange::import_ns::context,pstore::gsl::not_null<pstore::database*>const&>
            ((not_null<pstore::database_*> *)&local_60);
  local_50[0] = (database *)
                local_60.
                super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
  std::
  make_unique<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,pstore::uint128_const*>,pstore::exchange::import_ns::context*,pstore::transaction<std::unique_lock<mock_mutex>>*&,pstore::exchange::import_ns::string_mapping*&,pstore::uint128_const*&>
            ((context **)&local_70,(transaction<std::unique_lock<mock_mutex>_> **)local_50,local_38,
             &local_40);
  local_68._M_head_impl = &(local_70._M_head_impl)->super_rule;
  local_70._M_head_impl =
       (object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::transaction<std::unique_lock<mock_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*,_const_pstore::uint128_*>
        *)0x0;
  callbacks((callbacks *)in_RDI,&local_60,
            (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
             *)&local_68);
  if ((object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::transaction<std::unique_lock<mock_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*,_const_pstore::uint128_*>
       *)local_68._M_head_impl !=
      (object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::transaction<std::unique_lock<mock_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*,_const_pstore::uint128_*>
       *)0x0) {
    (*((rule *)&(local_68._M_head_impl)->_vptr_rule)->_vptr_rule[1])();
  }
  local_68._M_head_impl = (rule *)0x0;
  std::
  unique_ptr<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::transaction<std::unique_lock<mock_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*,_const_pstore::uint128_*>,_std::default_delete<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::transaction<std::unique_lock<mock_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*,_const_pstore::uint128_*>_>_>
  ::~unique_ptr((unique_ptr<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::transaction<std::unique_lock<mock_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*,_const_pstore::uint128_*>,_std::default_delete<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::transaction<std::unique_lock<mock_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*,_const_pstore::uint128_*>_>_>
                 *)&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.
              super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  cVar1.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  cVar1.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (callbacks)
         cVar1.context_.
         super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static callbacks make (gsl::not_null<database *> const db, Args... args) {
                    auto ctxt = std::make_shared<context> (db);
                    return {ctxt, std::make_unique<Rule> (ctxt.get (), args...)};
                }